

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::dec_writer>
          (basic_writer<fmt::v6::buffer_range<char>> *this,int num_digits,string_view prefix,
          format_specs specs,dec_writer f)

{
  ulong uVar1;
  uint uVar2;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::dec_writer>
  local_58;
  
  local_58.prefix.size_ = prefix.size_;
  local_58.prefix.data_ = prefix.data_;
  if (num_digits < 0) {
LAB_0013fd7a:
    assert_fail(specs._8_8_,0,specs._0_8_);
  }
  local_58.size_ = (uint)num_digits + local_58.prefix.size_;
  local_58.fill = specs.fill.data_[0];
  if ((specs._9_1_ & 0xf) == 4) {
    uVar1 = (ulong)specs.width;
    if ((long)uVar1 < 0) goto LAB_0013fd7a;
    local_58.padding = 0;
    if (local_58.size_ <= uVar1) {
      local_58.padding = uVar1 - local_58.size_;
      local_58.size_ = uVar1;
    }
  }
  else {
    uVar2 = specs.precision;
    if (num_digits < (int)uVar2) {
      if (((int)uVar2 < 0) || ((int)(uVar2 - num_digits) < 0)) goto LAB_0013fd7a;
      local_58.fill = '0';
      local_58.padding = (ulong)(uVar2 - num_digits);
      local_58.size_ = uVar2 + local_58.prefix.size_;
    }
    else {
      local_58.padding = 0;
    }
  }
  local_58.f.abs_value._0_8_ = (undefined8)f.abs_value;
  local_58.f.abs_value._8_8_ = f.abs_value._8_8_;
  local_58.f.num_digits = f.num_digits;
  local_58.f._20_4_ = f._20_4_;
  local_58.f._24_8_ = f._24_8_;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::dec_writer>>
            (this,(format_specs *)&stack0xffffffffffffff98,&local_58);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }